

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTextureTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::SparseTextureCommitmentTestCase::verifyTextureData
          (SparseTextureCommitmentTestCase *this,Functions *gl,GLint target,GLint format,
          GLuint *texture,GLint level)

{
  pointer puVar1;
  pointer piVar2;
  pointer __s;
  int iVar3;
  int iVar4;
  GLint GVar5;
  GLenum GVar6;
  int iVar7;
  int iVar8;
  ostream *poVar9;
  TransferFormat TVar10;
  TestError *this_00;
  ulong uVar11;
  int iVar12;
  TextureFormat *pTVar13;
  size_type sVar14;
  GLint GVar15;
  int iVar16;
  long lVar17;
  bool bVar18;
  bool bVar19;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vecExpData;
  vector<int,_std::allocator<int>_> subTargets;
  GLint depth;
  ulong local_78;
  TextureFormat *local_70;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vecOutData;
  GLint height;
  GLint width;
  
  poVar9 = std::operator<<((ostream *)&this->field_0x88,"Verify Texture [level: ");
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,level);
  std::operator<<(poVar9,"] - ");
  if ((this->mState).levels + -1 < level) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Invalid level",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureTests.cpp"
               ,0x7c5);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  TVar10 = glu::getTransferFormat((this->mState).format);
  SparseTextureUtils::getTextureLevelSize(target,&this->mState,level,&width,&height,&depth);
  iVar3 = width / 2;
  bVar18 = true;
  if ((height != 0 && 2 < width + 1U) && ((this->mState).minDepth <= depth)) {
    pTVar13 = &(this->mState).format;
    local_78 = (ulong)TVar10 >> 0x20;
    local_70 = pTVar13;
    if (target == 0x8513) {
      subTargets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      subTargets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      subTargets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)CONCAT44(vecExpData.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start._4_4_,0x8515);
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(&subTargets,(int *)&vecExpData);
      vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)CONCAT44(vecExpData.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start._4_4_,0x8516);
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(&subTargets,(int *)&vecExpData);
      vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)CONCAT44(vecExpData.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start._4_4_,0x8517);
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(&subTargets,(int *)&vecExpData);
      vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)CONCAT44(vecExpData.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start._4_4_,0x8518);
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(&subTargets,(int *)&vecExpData);
      vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)CONCAT44(vecExpData.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start._4_4_,0x8519);
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(&subTargets,(int *)&vecExpData);
      vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)CONCAT44(vecExpData.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start._4_4_,0x851a);
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(&subTargets,(int *)&vecExpData);
      iVar4 = tcu::TextureFormat::getPixelSize(pTVar13);
      vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      vecOutData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      vecOutData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      vecOutData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      sVar14 = (size_type)(height * width * iVar4);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&vecExpData,sVar14);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&vecOutData,sVar14);
      __s = vecOutData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start;
      puVar1 = vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      memset(vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start,(uint)(byte)((char)level * '\x10' + 0x10),sVar14);
      memset(__s,0xff,sVar14);
      iVar4 = 0;
      GVar5 = depth;
      if (depth < 1) {
        GVar5 = iVar4;
      }
      GVar15 = height;
      if (height < 1) {
        GVar15 = iVar4;
      }
      if (iVar3 < 1) {
        iVar3 = iVar4;
      }
      bVar18 = true;
      uVar11 = 0;
      do {
        if ((ulong)((long)subTargets.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)subTargets.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start >> 2) <= uVar11) break;
        GVar6 = subTargets.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar11];
        poVar9 = std::operator<<((ostream *)&this->field_0x88,"Verify Subtarget [subtarget: ");
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,GVar6);
        std::operator<<(poVar9,"] - ");
        memset(__s,0xff,sVar14);
        (*gl->getTexImage)(GVar6,level,TVar10.format,(GLenum)local_78,__s);
        GVar6 = (*gl->getError)();
        glu::checkError(GVar6,"Texture::GetData",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureTests.cpp"
                        ,0x813);
        for (iVar4 = 0; iVar4 != iVar3; iVar4 = iVar4 + 1) {
          for (iVar16 = 0; iVar16 != GVar15; iVar16 = iVar16 + 1) {
            iVar12 = GVar5;
            while (bVar19 = iVar12 != 0, iVar12 = iVar12 + -1, bVar19) {
              iVar7 = tcu::TextureFormat::getPixelSize(local_70);
              iVar8 = iVar7 * (iVar16 * width + iVar4);
              iVar7 = bcmp(puVar1 + iVar8,__s + iVar8,(long)iVar7);
              if (iVar7 != 0) {
                bVar18 = false;
              }
            }
          }
        }
        uVar11 = uVar11 + 1;
      } while (bVar18);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&vecOutData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&subTargets.super__Vector_base<int,_std::allocator<int>_>);
    }
    else {
      iVar4 = tcu::TextureFormat::getPixelSize(pTVar13);
      subTargets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      subTargets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      subTargets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      sVar14 = (size_type)(iVar4 * depth * height * width);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&subTargets,sVar14);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&vecExpData,sVar14);
      piVar2 = subTargets.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar1 = vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      memset(subTargets.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start,(uint)(byte)((char)level * '\x10' + 0x10),sVar14);
      memset(puVar1,0xff,sVar14);
      (*gl->getTexImage)(target,level,TVar10.format,(GLenum)local_78,puVar1);
      GVar6 = (*gl->getError)();
      glu::checkError(GVar6,"Texture::GetData",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureTests.cpp"
                      ,0x7e5);
      pTVar13 = local_70;
      if (depth < 1) {
        depth = 0;
      }
      GVar5 = height;
      if (height < 1) {
        GVar5 = 0;
      }
      if (iVar3 < 1) {
        iVar3 = 0;
      }
      bVar18 = true;
      for (iVar4 = 0; iVar4 != iVar3; iVar4 = iVar4 + 1) {
        for (iVar16 = 0; iVar16 != GVar5; iVar16 = iVar16 + 1) {
          iVar12 = depth;
          while (bVar19 = iVar12 != 0, iVar12 = iVar12 + -1, bVar19) {
            iVar7 = tcu::TextureFormat::getPixelSize(pTVar13);
            lVar17 = (long)(iVar7 * (iVar16 * width + iVar4));
            iVar7 = bcmp((void *)((long)piVar2 + lVar17),puVar1 + lVar17,(long)iVar7);
            if (iVar7 != 0) {
              bVar18 = false;
            }
          }
        }
      }
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&subTargets);
    }
  }
  return bVar18;
}

Assistant:

bool SparseTextureCommitmentTestCase::verifyTextureData(const Functions& gl, GLint target, GLint format,
														GLuint& texture, GLint level)
{
	DE_UNREF(format);
	DE_UNREF(texture);

	mLog << "Verify Texture [level: " << level << "] - ";

	if (level > mState.levels - 1)
		TCU_FAIL("Invalid level");

	TransferFormat transferFormat = glu::getTransferFormat(mState.format);

	GLint width;
	GLint height;
	GLint depth;
	SparseTextureUtils::getTextureLevelSize(target, mState, level, width, height, depth);

	//Committed region is limited to 1/2 of width
	GLint widthCommitted = width / 2;

	if (widthCommitted == 0 || height == 0 || depth < mState.minDepth)
		return true;

	bool result = true;

	if (target != GL_TEXTURE_CUBE_MAP)
	{
		GLint texSize = width * height * depth * mState.format.getPixelSize();

		std::vector<GLubyte> vecExpData;
		std::vector<GLubyte> vecOutData;
		vecExpData.resize(texSize);
		vecOutData.resize(texSize);
		GLubyte* exp_data = vecExpData.data();
		GLubyte* out_data = vecOutData.data();

		deMemset(exp_data, 16 + 16 * level, texSize);
		deMemset(out_data, 255, texSize);

		Texture::GetData(gl, level, target, transferFormat.format, transferFormat.dataType, (GLvoid*)out_data);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Texture::GetData");

		//Verify only committed region
		for (GLint x = 0; x < widthCommitted; ++x)
			for (GLint y = 0; y < height; ++y)
				for (GLint z = 0; z < depth; ++z)
				{
					int		 pixelSize	 = mState.format.getPixelSize();
					GLubyte* dataRegion	= exp_data + ((x + y * width) * pixelSize);
					GLubyte* outDataRegion = out_data + ((x + y * width) * pixelSize);
					if (deMemCmp(dataRegion, outDataRegion, pixelSize) != 0)
						result = false;
				}
	}
	else
	{
		std::vector<GLint> subTargets;

		subTargets.push_back(GL_TEXTURE_CUBE_MAP_POSITIVE_X);
		subTargets.push_back(GL_TEXTURE_CUBE_MAP_NEGATIVE_X);
		subTargets.push_back(GL_TEXTURE_CUBE_MAP_POSITIVE_Y);
		subTargets.push_back(GL_TEXTURE_CUBE_MAP_NEGATIVE_Y);
		subTargets.push_back(GL_TEXTURE_CUBE_MAP_POSITIVE_Z);
		subTargets.push_back(GL_TEXTURE_CUBE_MAP_NEGATIVE_Z);

		GLint texSize = width * height * mState.format.getPixelSize();

		std::vector<GLubyte> vecExpData;
		std::vector<GLubyte> vecOutData;
		vecExpData.resize(texSize);
		vecOutData.resize(texSize);
		GLubyte* exp_data = vecExpData.data();
		GLubyte* out_data = vecOutData.data();

		deMemset(exp_data, 16 + 16 * level, texSize);
		deMemset(out_data, 255, texSize);

		for (size_t i = 0; i < subTargets.size(); ++i)
		{
			GLint subTarget = subTargets[i];

			mLog << "Verify Subtarget [subtarget: " << subTarget << "] - ";

			deMemset(out_data, 255, texSize);

			Texture::GetData(gl, level, subTarget, transferFormat.format, transferFormat.dataType, (GLvoid*)out_data);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Texture::GetData");

			//Verify only committed region
			for (GLint x = 0; x < widthCommitted; ++x)
				for (GLint y = 0; y < height; ++y)
					for (GLint z = 0; z < depth; ++z)
					{
						int		 pixelSize	 = mState.format.getPixelSize();
						GLubyte* dataRegion	= exp_data + ((x + y * width) * pixelSize);
						GLubyte* outDataRegion = out_data + ((x + y * width) * pixelSize);
						if (deMemCmp(dataRegion, outDataRegion, pixelSize) != 0)
							result = false;
					}

			if (!result)
				break;
		}
	}

	return result;
}